

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureDoesNotSendRedundantResendRequests::RunImpl
          (TestsessionFixtureDoesNotSendRedundantResendRequests *this)

{
  TestDetails *details;
  sessionFixtureDoesNotSendRedundantResendRequestsHelper fixtureHelper;
  sessionFixtureDoesNotSendRedundantResendRequestsHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureDoesNotSendRedundantResendRequestsHelper::
  sessionFixtureDoesNotSendRedundantResendRequestsHelper(&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureDoesNotSendRedundantResendRequestsHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, DoesNotSendRedundantResendRequests) {
  createSession(1);
  object->setSendRedundantResendRequests(false);
  CHECK(!object->getSendRedundantResendRequests());
}